

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::StorageImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  int iVar1;
  bool bVar2;
  TextureChannelClass TVar3;
  TextureFormat TVar4;
  ostream *poVar5;
  ProgramSources *this;
  char *pcVar6;
  char *__rhs;
  char *__s;
  allocator<char> local_2c1;
  string formatPart;
  string texelCoordStr;
  string gvec4Expr;
  string local_258;
  string local_238;
  string signednessPrefix;
  string formatQualifierStr;
  string imageTypeStr;
  CaseDef local_1b4;
  ostringstream src;
  
  CaseDef::CaseDef(&local_1b4,caseDef);
  addSimpleVertexAndFragmentPrograms(programCollection,&local_1b4);
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar1 = caseDef->numLayers;
  TVar3 = tcu::getTextureChannelClass(TVar4.type);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar6 = "u";
  }
  else {
    TVar3 = tcu::getTextureChannelClass(TVar4.type);
    pcVar6 = "";
    if (TVar3 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      pcVar6 = "i";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&formatPart,pcVar6,(allocator<char> *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar5 = std::operator<<((ostream *)&src,(string *)&formatPart);
  poVar5 = std::operator<<(poVar5,"image2DMS");
  pcVar6 = "Array";
  __s = "";
  if (iVar1 < 2) {
    pcVar6 = "";
  }
  std::operator<<(poVar5,pcVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&formatPart);
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  if (TVar4.order < ARGB) {
    pcVar6 = *(char **)(&DAT_00bfc9a0 + (ulong)(TVar4.order & sRGBA) * 8);
  }
  else {
    pcVar6 = (char *)0x0;
  }
  switch(TVar4.type) {
  case SIGNED_INT8:
    __rhs = "8i";
    break;
  case SIGNED_INT16:
    __rhs = "16i";
    break;
  case SIGNED_INT32:
    __rhs = "32i";
    break;
  case UNSIGNED_INT8:
    __rhs = "8ui";
    break;
  case UNSIGNED_INT16:
    __rhs = "16ui";
    break;
  case UNSIGNED_INT32:
    __rhs = "32ui";
    break;
  case HALF_FLOAT:
    __rhs = "16f";
    break;
  case FLOAT:
    __rhs = "32f";
    break;
  default:
    if (TVar4.type < UNORM_INT24) {
      (*(code *)(&DAT_009824d0 + *(int *)(&DAT_009824d0 + ((ulong)TVar4 >> 0x20) * 4)))();
      return;
    }
  case UNSIGNED_INT24:
    __rhs = (char *)0x0;
  }
  formatPart._M_dataplus._M_p = (pointer)&formatPart.field_2;
  formatPart._M_string_length = 0;
  formatPart.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                 &formatPart,pcVar6);
  std::operator+(&formatQualifierStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,__rhs);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&formatPart);
  bVar2 = ::vk::isUintFormat(caseDef->colorFormat);
  if (bVar2) {
    __s = "u";
  }
  else {
    bVar2 = ::vk::isIntFormat(caseDef->colorFormat);
    if (bVar2) {
      __s = "i";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signednessPrefix,__s,(allocator<char> *)&src);
  std::operator+(&gvec4Expr,&signednessPrefix,"vec4");
  pcVar6 = "ivec3(gx, gy, gz)";
  if (caseDef->numLayers == 1) {
    pcVar6 = "ivec2(gx, gy)";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texelCoordStr,pcVar6,(allocator<char> *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar5 = std::operator<<((ostream *)&src,pcVar6);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(local_size_x = 1) in;\n");
  poVar5 = std::operator<<(poVar5,"layout(set = 0, binding = 0, ");
  poVar5 = std::operator<<(poVar5,(string *)&formatQualifierStr);
  poVar5 = std::operator<<(poVar5,") uniform ");
  poVar5 = std::operator<<(poVar5,(string *)&imageTypeStr);
  poVar5 = std::operator<<(poVar5," u_msImage;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main(void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    int gx = int(gl_GlobalInvocationID.x);\n");
  poVar5 = std::operator<<(poVar5,"    int gy = int(gl_GlobalInvocationID.y);\n");
  poVar5 = std::operator<<(poVar5,"    int gz = int(gl_GlobalInvocationID.z);\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    ");
  poVar5 = std::operator<<(poVar5,(string *)&gvec4Expr);
  poVar5 = std::operator<<(poVar5," prevColor = imageLoad(u_msImage, ");
  poVar5 = std::operator<<(poVar5,(string *)&texelCoordStr);
  poVar5 = std::operator<<(poVar5,", 0);\n");
  poVar5 = std::operator<<(poVar5,"    for (int sampleNdx = 1; sampleNdx < ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,caseDef->numSamples);
  poVar5 = std::operator<<(poVar5,"; ++sampleNdx) {\n");
  poVar5 = std::operator<<(poVar5,"        ");
  poVar5 = std::operator<<(poVar5,(string *)&gvec4Expr);
  poVar5 = std::operator<<(poVar5," color = imageLoad(u_msImage, ");
  poVar5 = std::operator<<(poVar5,(string *)&texelCoordStr);
  poVar5 = std::operator<<(poVar5,", sampleNdx);\n");
  poVar5 = std::operator<<(poVar5,"        imageStore(u_msImage, ");
  poVar5 = std::operator<<(poVar5,(string *)&texelCoordStr);
  poVar5 = std::operator<<(poVar5,", sampleNdx, prevColor);\n");
  poVar5 = std::operator<<(poVar5,"        prevColor = color;\n");
  poVar5 = std::operator<<(poVar5,"    }\n");
  poVar5 = std::operator<<(poVar5,"    imageStore(u_msImage, ");
  poVar5 = std::operator<<(poVar5,(string *)&texelCoordStr);
  poVar5 = std::operator<<(poVar5,", 0, prevColor);\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"comp",&local_2c1);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add
                   (&programCollection->glslSources,&local_238);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&formatPart,&local_258);
  glu::ProgramSources::operator<<(this,(ShaderSource *)&formatPart);
  std::__cxx11::string::~string((string *)&formatPart._M_string_length);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&texelCoordStr);
  std::__cxx11::string::~string((string *)&gvec4Expr);
  std::__cxx11::string::~string((string *)&signednessPrefix);
  std::__cxx11::string::~string((string *)&formatQualifierStr);
  std::__cxx11::string::~string((string *)&imageTypeStr);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Vertex & fragment

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Compute
	{
		const std::string	imageTypeStr		= getShaderMultisampledImageType(mapVkFormat(caseDef.colorFormat), caseDef.numLayers);
		const std::string	formatQualifierStr	= getShaderImageFormatQualifier(mapVkFormat(caseDef.colorFormat));
		const std::string	signednessPrefix	= isUintFormat(caseDef.colorFormat) ? "u" : isIntFormat(caseDef.colorFormat) ? "i" : "";
		const std::string	gvec4Expr			= signednessPrefix + "vec4";
		const std::string	texelCoordStr		= (caseDef.numLayers == 1 ? "ivec2(gx, gy)" : "ivec3(gx, gy, gz)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "layout(set = 0, binding = 0, " << formatQualifierStr << ") uniform " << imageTypeStr << " u_msImage;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int gx = int(gl_GlobalInvocationID.x);\n"
			<< "    int gy = int(gl_GlobalInvocationID.y);\n"
			<< "    int gz = int(gl_GlobalInvocationID.z);\n"
			<< "\n"
			<< "    " << gvec4Expr << " prevColor = imageLoad(u_msImage, " << texelCoordStr << ", 0);\n"
			<< "    for (int sampleNdx = 1; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
			<< "        " << gvec4Expr << " color = imageLoad(u_msImage, " << texelCoordStr << ", sampleNdx);\n"
			<< "        imageStore(u_msImage, " << texelCoordStr <<", sampleNdx, prevColor);\n"
			<< "        prevColor = color;\n"
			<< "    }\n"
			<< "    imageStore(u_msImage, " << texelCoordStr <<", 0, prevColor);\n"
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}